

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_gtest_utils.hpp
# Opt level: O2

void unodb::test::QSBRTestBase::qsbr_deallocate(void *ptr)

{
  bool bVar1;
  qsbr_per_thread *pqVar2;
  qsbr *pqVar3;
  char *pcVar4;
  char *in_R9;
  code *local_a0 [2];
  code *local_90;
  code *local_88;
  size_t local_80;
  size_t current_interval_total_dealloc_size_before;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_48;
  bool previous_interval_empty_after;
  undefined1 local_3a;
  undefined1 local_39;
  bool previous_interval_empty_before;
  size_t sStack_38;
  bool current_interval_empty_before;
  size_t current_interval_total_dealloc_size_after;
  AssertHelper AStack_28;
  bool current_interval_empty_after;
  
  pqVar2 = qsbr_per_thread::get_instance();
  local_80 = pqVar2->current_interval_total_dealloc_size;
  pqVar2 = qsbr_per_thread::get_instance();
  local_3a = (pqVar2->previous_interval_dealloc_requests).
             super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (pqVar2->previous_interval_dealloc_requests).
             super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pqVar2 = qsbr_per_thread::get_instance();
  local_39 = (pqVar2->current_interval_dealloc_requests).
             super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (pqVar2->current_interval_dealloc_requests).
             super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pqVar2 = qsbr_per_thread::get_instance();
  local_a0[1] = (code *)0x0;
  local_a0[0] = check_ptr_on_qsbr_dealloc;
  local_88 = std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::_M_invoke
  ;
  local_90 = std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::
             _M_manager;
  qsbr_per_thread::on_next_epoch_deallocate(pqVar2,ptr,1,(debug_callback *)local_a0);
  std::_Function_base::~_Function_base((_Function_base *)local_a0);
  pqVar2 = qsbr_per_thread::get_instance();
  sStack_38 = pqVar2->current_interval_total_dealloc_size;
  pqVar2 = qsbr_per_thread::get_instance();
  current_interval_total_dealloc_size_after._7_1_ =
       (pqVar2->current_interval_dealloc_requests).
       super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (pqVar2->current_interval_dealloc_requests).
       super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pqVar3 = qsbr::instance();
  bVar1 = qsbr_state::single_thread_mode((pqVar3->state).super___atomic_base<unsigned_long>._M_i);
  current_interval_total_dealloc_size_before._0_4_ =
       CONCAT31(current_interval_total_dealloc_size_before._1_3_,sStack_38 == 0);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_.message_,"(current_interval_empty_after)",
             "((current_interval_total_dealloc_size_after == 0))",
             (bool *)((long)&current_interval_total_dealloc_size_after + 7),
             (bool *)&current_interval_total_dealloc_size_before);
  if ((char)gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)&current_interval_total_dealloc_size_before);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xd3,pcVar4);
    testing::internal::AssertHelper::operator=
              (&stack0xffffffffffffffd8,(Message *)&current_interval_total_dealloc_size_before);
    testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
    if ((long *)CONCAT44(current_interval_total_dealloc_size_before._4_4_,
                         (undefined4)current_interval_total_dealloc_size_before) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(current_interval_total_dealloc_size_before._4_4_,
                                     (undefined4)current_interval_total_dealloc_size_before) + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  if (bVar1) {
    bVar1 = sStack_38 == 0 || local_80 == sStack_38;
    current_interval_total_dealloc_size_before._0_4_ =
         CONCAT31(current_interval_total_dealloc_size_before._1_3_,bVar1);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (bVar1) goto LAB_0011b2a8;
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&current_interval_total_dealloc_size_before
               ,(AssertionResult *)
                "current_interval_total_dealloc_size_before == current_interval_total_dealloc_size_after || current_interval_total_dealloc_size_after == 0"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xd7,(char *)CONCAT71(gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._1_7_,
                                      (char)gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&stack0xffffffffffffffd8);
  }
  else {
    current_interval_total_dealloc_size_before._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&gtest_ar_.message_,"(current_interval_total_dealloc_size_after)","(0)",
               &stack0xffffffffffffffc8,(int *)&current_interval_total_dealloc_size_before);
    if ((char)gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl == '\0') {
      testing::Message::Message((Message *)&current_interval_total_dealloc_size_before);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&stack0xffffffffffffffd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
                 ,0xd9,pcVar4);
      testing::internal::AssertHelper::operator=
                (&stack0xffffffffffffffd8,(Message *)&current_interval_total_dealloc_size_before);
      testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
      if ((long *)CONCAT44(current_interval_total_dealloc_size_before._4_4_,
                           (undefined4)current_interval_total_dealloc_size_before) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(current_interval_total_dealloc_size_before._4_4_,
                                       (undefined4)current_interval_total_dealloc_size_before) + 8))
                  ();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    bVar1 = sStack_38 == local_80 + 1 || sStack_38 == 1;
    current_interval_total_dealloc_size_before._0_4_ =
         CONCAT31(current_interval_total_dealloc_size_before._1_3_,bVar1);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (bVar1) goto LAB_0011b2a8;
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&current_interval_total_dealloc_size_before
               ,(AssertionResult *)
                "current_interval_total_dealloc_size_after == 1 || (current_interval_total_dealloc_size_after == current_interval_total_dealloc_size_before + 1)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xdc,(char *)CONCAT71(gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._1_7_,
                                      (char)gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&stack0xffffffffffffffd8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  if (AStack_28.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)AStack_28.data_ + 8))();
  }
LAB_0011b2a8:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  return;
}

Assistant:

static void qsbr_deallocate(void *ptr) {
#ifdef UNODB_DETAIL_WITH_STATS
    const auto current_interval_total_dealloc_size_before =
        unodb::this_thread().get_current_interval_total_dealloc_size();
#endif  // UNODB_DETAIL_WITH_STATS
    const auto previous_interval_empty_before =
        unodb::this_thread().previous_interval_requests_empty();
    const auto current_interval_empty_before =
        unodb::this_thread().current_interval_requests_empty();

    try {
      unodb::this_thread().on_next_epoch_deallocate(ptr
#ifdef UNODB_DETAIL_WITH_STATS
                                                    ,
                                                    1
#endif
#ifndef NDEBUG
                                                    ,
                                                    check_ptr_on_qsbr_dealloc
#endif
      );
    } catch (...) {
      const auto previous_interval_empty_after =
          unodb::this_thread().previous_interval_requests_empty();
      const auto current_interval_empty_after =
          unodb::this_thread().current_interval_requests_empty();
#ifdef UNODB_DETAIL_WITH_STATS
      const auto current_interval_total_dealloc_size_after =
          unodb::this_thread().get_current_interval_total_dealloc_size();
      UNODB_EXPECT_EQ(current_interval_total_dealloc_size_before,
                      current_interval_total_dealloc_size_after);
#endif  // UNODB_DETAIL_WITH_STATS
      UNODB_EXPECT_EQ(previous_interval_empty_before,
                      previous_interval_empty_after);
      UNODB_EXPECT_EQ(current_interval_empty_before,
                      current_interval_empty_after);
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto current_interval_total_dealloc_size_after =
        unodb::this_thread().get_current_interval_total_dealloc_size();
    const auto current_interval_empty_after =
        unodb::this_thread().current_interval_requests_empty();
    const auto single_thread_mode =
        qsbr_state::single_thread_mode(qsbr::instance().get_state());
    UNODB_EXPECT_EQ(current_interval_empty_after,
                    (current_interval_total_dealloc_size_after == 0));
    if (single_thread_mode) {
      UNODB_EXPECT_TRUE(current_interval_total_dealloc_size_before ==
                            current_interval_total_dealloc_size_after ||
                        current_interval_total_dealloc_size_after == 0);
    } else {
      UNODB_EXPECT_GT(current_interval_total_dealloc_size_after, 0);
      UNODB_EXPECT_TRUE(current_interval_total_dealloc_size_after == 1 ||
                        (current_interval_total_dealloc_size_after ==
                         current_interval_total_dealloc_size_before + 1));
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }